

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O1

void __thiscall UnitTest_semantic1::Run(UnitTest_semantic1 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  UnitTestBase *this_00;
  Terminator *pTVar2;
  Terminator *pTVar3;
  Terminator *pTVar4;
  Terminator *pTVar5;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  string local_80;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  UnitTestBase *local_38;
  
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"a, b = c, d","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_60,&local_80);
  local_38 = &this->super_UnitTestBase;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"a","");
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_58,local_58 + local_50);
  pTVar2 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_60,(FindName *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"b","");
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_58,local_58 + local_50);
  pTVar3 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_60,(FindName *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"c","");
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_58,local_58 + local_50);
  pTVar4 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_60,(FindName *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"d","");
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_58,local_58 + local_50);
  pTVar5 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_60,(FindName *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  this_00 = local_38;
  if (pTVar2->semantic_ != SemanticOp_Write) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"\'a->semantic_ == luna::SemanticOp_Write\'","");
    UnitTestBase::Error(this_00,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (pTVar3->semantic_ != SemanticOp_Write) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"\'b->semantic_ == luna::SemanticOp_Write\'","");
    UnitTestBase::Error(this_00,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (pTVar4->semantic_ != SemanticOp_Read) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"\'c->semantic_ == luna::SemanticOp_Read\'","");
    UnitTestBase::Error(this_00,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (pTVar5->semantic_ != SemanticOp_Read) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"\'d->semantic_ == luna::SemanticOp_Read\'","");
    UnitTestBase::Error(this_00,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (local_60._M_head_impl != (SyntaxTree *)0x0) {
    (*(local_60._M_head_impl)->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic1)
{
    auto ast = Semantic("a, b = c, d");
    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    auto b = ASTFind<luna::Terminator>(ast, FindName("b"));
    auto c = ASTFind<luna::Terminator>(ast, FindName("c"));
    auto d = ASTFind<luna::Terminator>(ast, FindName("d"));
    EXPECT_TRUE(a->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(b->semantic_ == luna::SemanticOp_Write);
    EXPECT_TRUE(c->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(d->semantic_ == luna::SemanticOp_Read);
}